

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  unsigned_long context_lines;
  unsigned_long base_offset;
  FILE *f;
  FILE *f_00;
  bool use_color;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename1;
  string data2;
  string data1;
  Arguments args;
  
  phosg::Arguments::Arguments(&args,argv,(long)argc);
  bVar2 = phosg::Arguments::get<bool>(&args,"help");
  if (bVar2) {
    main_cold_1();
    goto LAB_001061a8;
  }
  pbVar4 = phosg::Arguments::
           get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     (&args,1,true);
  pcVar1 = (pbVar4->_M_dataplus)._M_p;
  filename1._M_dataplus._M_p = (pointer)&filename1.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename1,pcVar1,pcVar1 + pbVar4->_M_string_length);
  pbVar4 = phosg::Arguments::
           get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     (&args,2,true);
  pcVar1 = (pbVar4->_M_dataplus)._M_p;
  filename2._M_dataplus._M_p = (pointer)&filename2.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename2,pcVar1,pcVar1 + pbVar4->_M_string_length);
  if (filename1._M_string_length == filename2._M_string_length) {
    if (filename1._M_string_length != 0) {
      iVar3 = bcmp(filename1._M_dataplus._M_p,filename2._M_dataplus._M_p,filename1._M_string_length)
      ;
      if (iVar3 != 0) goto LAB_00106018;
    }
  }
  else {
LAB_00106018:
    bVar2 = phosg::Arguments::get<bool>(&args,"no-color");
    if (bVar2) {
      use_color = false;
    }
    else {
      bVar2 = phosg::Arguments::get<bool>(&args,"color");
      use_color = true;
      if (!bVar2) {
        iVar3 = fileno(_stdout);
        iVar3 = isatty(iVar3);
        use_color = iVar3 != 0;
      }
    }
    context_lines =
         phosg::Arguments::get<unsigned_long,_char[8]>(&args,(char (*) [8])0x11c064,3,DEFAULT);
    base_offset = phosg::Arguments::get<unsigned_long,_char[14]>
                            (&args,(char (*) [14])"start-address",0,HEX);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&filename1,"-");
    if (iVar3 == 0) {
      phosg::read_all_abi_cxx11_((string *)&data1,_stdin,f);
    }
    else {
      phosg::load_file((string *)&data1,(string *)&filename1);
    }
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&filename2,"-");
    if (iVar3 == 0) {
      phosg::read_all_abi_cxx11_((string *)&data2,_stdin,f_00);
    }
    else {
      phosg::load_file((string *)&data2,(string *)&filename2);
    }
    print_binary_diff((FILE *)_stdout,data1._M_dataplus._M_p,data1._M_string_length,
                      data2._M_dataplus._M_p,data2._M_string_length,use_color,context_lines,
                      base_offset);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data2._M_dataplus._M_p != &data2.field_2) {
      operator_delete(data2._M_dataplus._M_p,data2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data1._M_dataplus._M_p != &data1.field_2) {
      operator_delete(data1._M_dataplus._M_p,data1.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename2._M_dataplus._M_p != &filename2.field_2) {
    operator_delete(filename2._M_dataplus._M_p,filename2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename1._M_dataplus._M_p != &filename1.field_2) {
    operator_delete(filename1._M_dataplus._M_p,filename1.field_2._M_allocated_capacity + 1);
  }
LAB_001061a8:
  std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>::~vector
            (&args.positional);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&args);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  Arguments args(argv, argc);
  if (args.get<bool>("help")) {
    print_usage();
    return 0;
  }

  auto filename1 = args.get<string>(1);
  auto filename2 = args.get<string>(2);
  if (filename1 == filename2) {
    return 0;
  }

  bool use_color;
  if (args.get<bool>("no-color")) {
    use_color = false;
  } else if (args.get<bool>("color")) {
    use_color = true;
  } else {
    use_color = isatty(fileno(stdout));
  }
  size_t context_lines = args.get<size_t>("context", 3);
  uint64_t base_offset = args.get<uint64_t>("start-address", 0, phosg::Arguments::IntFormat::HEX);

  string data1 = (filename1 == "-") ? read_all(stdin) : load_file(filename1);
  string data2 = (filename2 == "-") ? read_all(stdin) : load_file(filename2);

  print_binary_diff(stdout, data1.data(), data1.size(), data2.data(), data2.size(), use_color, context_lines, base_offset);
  return 0;
}